

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int XMLNode_get_children_count(XMLNode *node)

{
  int local_20;
  int local_1c;
  int n;
  int i;
  XMLNode *node_local;
  
  if ((node == (XMLNode *)0x0) || (node->init_value != 0x19770522)) {
    node_local._4_4_ = -1;
  }
  else {
    local_20 = 0;
    for (local_1c = 0; local_1c < node->n_children; local_1c = local_1c + 1) {
      if (node->children[local_1c]->active != 0) {
        local_20 = local_20 + 1;
      }
    }
    node_local._4_4_ = local_20;
  }
  return node_local._4_4_;
}

Assistant:

int XMLNode_get_children_count(const XMLNode* node)
{
	int i, n;

	CHECK_NODE(node, -1);

	for (i = n = 0; i < node->n_children; i++)
		if (node->children[i]->active)
			n++;
	
	return n;
}